

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

void fft(float *in,int N,float *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  int iVar7;
  long lVar8;
  float *in_RDX;
  int in_ESI;
  float *in_RDI;
  float im_odd;
  float re_odd;
  float im;
  float re;
  int idx;
  int k;
  int sin_cos_step;
  float *odd_fft;
  int i_1;
  float *odd;
  float *even_fft;
  int i;
  float *even;
  int half_N;
  int local_58;
  int local_44;
  int local_2c;
  undefined4 in_stack_ffffffffffffffe0;
  float *pfVar9;
  undefined4 in_stack_fffffffffffffff0;
  int iVar10;
  
  if (in_ESI == 1) {
    *in_RDX = *in_RDI;
    in_RDX[1] = 0.0;
  }
  else {
    iVar4 = in_ESI / 2;
    if (in_ESI % 2 == 1) {
      dft(in_RDI,in_ESI,in_RDX);
    }
    else {
      for (local_2c = 0; local_2c < iVar4; local_2c = local_2c + 1) {
        in_RDI[(long)in_ESI + (long)local_2c] = in_RDI[local_2c << 1];
      }
      iVar7 = in_ESI << 1;
      pfVar9 = in_RDX;
      iVar10 = in_ESI;
      fft((float *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
          (float *)CONCAT44(iVar4,in_stack_ffffffffffffffe0));
      for (local_44 = 0; local_44 < iVar4; local_44 = local_44 + 1) {
        in_RDI[(long)in_ESI + (long)local_44] = in_RDI[local_44 * 2 + 1];
      }
      lVar8 = (long)iVar10;
      fft((float *)CONCAT44(iVar10,in_stack_fffffffffffffff0),(int)((ulong)pfVar9 >> 0x20),
          (float *)CONCAT44(iVar4,in_stack_ffffffffffffffe0));
      for (local_58 = 0; local_58 < iVar4; local_58 = local_58 + 1) {
        iVar5 = local_58 * (int)(400 / (long)iVar10);
        fVar1 = *(float *)((anonymous_namespace)::global_cache + (long)iVar5 * 4 + 0x640);
        fVar6 = -*(float *)((anonymous_namespace)::global_cache + (long)iVar5 * 4);
        fVar2 = in_RDX[(long)iVar7 + lVar8 + (local_58 << 1)];
        fVar3 = in_RDX[(long)iVar7 + lVar8 + (local_58 * 2 + 1)];
        pfVar9[local_58 << 1] =
             -fVar6 * fVar3 + fVar1 * fVar2 + in_RDX[(long)iVar7 + (long)(local_58 << 1)];
        pfVar9[local_58 * 2 + 1] =
             fVar6 * fVar2 + fVar1 * fVar3 + in_RDX[(long)iVar7 + (long)(local_58 * 2 + 1)];
        pfVar9[(local_58 + iVar4) * 2] =
             fVar6 * fVar3 + -fVar1 * fVar2 + in_RDX[(long)iVar7 + (long)(local_58 << 1)];
        pfVar9[(local_58 + iVar4) * 2 + 1] =
             -fVar6 * fVar2 + -fVar1 * fVar3 + in_RDX[(long)iVar7 + (long)(local_58 * 2 + 1)];
      }
    }
  }
  return;
}

Assistant:

static void fft(float* in, int N, float* out) {
    if (N == 1) {
        out[0] = in[0];
        out[1] = 0;
        return;
    }

    const int half_N = N / 2;
    if (N - half_N*2 == 1) {
        dft(in, N, out);
        return;
    }

    float* even = in + N;
    for (int i = 0; i < half_N; ++i) {
        even[i]= in[2*i];
    }
    float* even_fft = out + 2 * N;
    fft(even, half_N, even_fft);

    float* odd = even;
    for (int i = 0; i < half_N; ++i) {
        odd[i] = in[2*i + 1];
    }
    float* odd_fft = even_fft + N;
    fft(odd, half_N, odd_fft);

    const int sin_cos_step = SIN_COS_N_COUNT / N;
    for (int k = 0; k < half_N; k++) {
        int idx = k * sin_cos_step; // t = 2*M_PI*k/N
        float re = global_cache.cos_vals[idx]; // cos(t)
        float im = -global_cache.sin_vals[idx]; // sin(t)

        float re_odd = odd_fft[2*k + 0];
        float im_odd = odd_fft[2*k + 1];

        out[2*k + 0] = even_fft[2*k + 0] + re*re_odd - im*im_odd;
        out[2*k + 1] = even_fft[2*k + 1] + re*im_odd + im*re_odd;

        out[2*(k + half_N) + 0] = even_fft[2*k + 0] - re*re_odd + im*im_odd;
        out[2*(k + half_N) + 1] = even_fft[2*k + 1] - re*im_odd - im*re_odd;
    }
}